

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O3

bool __thiscall doublechecked::Roaring::containsRange(Roaring *this,uint64_t x,uint64_t y)

{
  ulong uVar1;
  _Bool _Var2;
  _Rb_tree_node_base *p_Var3;
  int line;
  _Base_ptr p_Var4;
  _Rb_tree_node_base *p_Var5;
  char *expression;
  unsigned_long result;
  _Rb_tree_color _Var6;
  ulong uVar7;
  _Rb_tree_header *p_Var8;
  bool bVar9;
  
  _Var2 = roaring_bitmap_contains_range((roaring_bitmap_t *)this,x,y);
  p_Var4 = (this->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var8 = &(this->check)._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = &p_Var8->_M_header;
  p_Var5 = &p_Var8->_M_header;
  if (p_Var4 != (_Rb_tree_node_base *)0x0) {
    do {
      _Var6 = (_Rb_tree_color)x;
      bVar9 = p_Var4[1]._M_color < _Var6;
      if (!bVar9) {
        p_Var5 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[bVar9];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 != p_Var8) && (p_Var3 = p_Var5, _Var6 < p_Var5[1]._M_color)) {
      p_Var3 = &p_Var8->_M_header;
    }
  }
  if (x < y) {
    if ((_Rb_tree_header *)p_Var3 == p_Var8) {
      result = (unsigned_long)!_Var2;
      expression = "ans == false";
      line = 0xb8;
    }
    else {
      uVar1 = x + 1;
      do {
        uVar7 = uVar1;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
        if (((_Rb_tree_header *)p_Var3 == p_Var8) || (uVar7 != p_Var3[1]._M_color)) break;
        uVar1 = uVar7 + 1;
      } while (p_Var3[1]._M_color < y);
      result = (unsigned_long)(_Var2 != (y != uVar7));
      expression = "ans == (last == y - 1)";
      line = 0xbd;
    }
  }
  else {
    result = (unsigned_long)_Var2;
    expression = "ans == true";
    line = 0xb6;
  }
  _assert_true(result,expression,
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring_checked.hh"
               ,line);
  return _Var2;
}

Assistant:

bool containsRange(const uint64_t x, const uint64_t y) const {
        bool ans = plain.containsRange(x, y);

        auto it = check.find(x);
        if (x >= y)
            assert_true(ans == true);  // roaring says true for this
        else if (it == check.end())
            assert_true(ans == false);  // start of range not in set
        else {
            uint64_t last = x;  // iterate up to y so long as values sequential
            while (++it != check.end() && last + 1 == *it && *it < y)
                last = *it;
            assert_true(ans == (last == y - 1));
        }

        return ans;
    }